

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O2

Vector3D * __thiscall
CMU462::DynamicScene::Joint::getAngle(Vector3D *__return_storage_ptr__,Joint *this,double time)

{
  Spline<CMU462::Vector3D>::operator()
            (__return_storage_ptr__,&(this->super_SceneObject).rotations,time);
  return __return_storage_ptr__;
}

Assistant:

Vector3D Joint::getAngle( double time )
   {
      return rotations(time);
   }